

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

void __thiscall PKCS12Test_MissingContent_Test::TestBody(PKCS12Test_MissingContent_Test *this)

{
  bool bVar1;
  int iVar2;
  stack_st_X509 *psVar3;
  char *pcVar4;
  pointer psVar5;
  char *in_R9;
  undefined1 auVar6 [16];
  Span<const_unsigned_char> SVar7;
  string_view s;
  string_view s_00;
  string_view s_01;
  string local_2e0;
  AssertHelper local_2c0;
  Message local_2b8;
  bool local_2a9;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar__5;
  undefined1 local_278 [8];
  CBS cbs_2;
  EVP_PKEY *key_2;
  AssertHelper local_240;
  Message local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<struct_stack_st_X509> certs_2;
  string data_2;
  AssertHelper local_1d8;
  Message local_1d0;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__3;
  undefined1 local_190 [8];
  CBS cbs_1;
  EVP_PKEY *key_1;
  AssertHelper local_158;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<struct_stack_st_X509> certs_1;
  string data_1;
  AssertHelper local_f0;
  Message local_e8;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_a8 [8];
  CBS cbs;
  EVP_PKEY *key;
  string local_88;
  AssertHelper local_68;
  Message local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_;
  unique_ptr<stack_st_X509,_bssl::internal::Deleter> local_38;
  UniquePtr<struct_stack_st_X509> certs;
  string data;
  PKCS12Test_MissingContent_Test *this_local;
  
  GetTestData_abi_cxx11_((string *)&certs,"crypto/pkcs8/test/bad1.p12");
  psVar3 = sk_X509_new_null();
  std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&local_38,psVar3);
  testing::AssertionResult::AssertionResult<std::unique_ptr<stack_st_X509,bssl::internal::Deleter>>
            ((AssertionResult *)local_58,&local_38,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(internal *)local_58,(AssertionResult *)0x8ba81c,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x295,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    testing::Message::~Message(&local_60);
  }
  bVar1 = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  if (!bVar1) {
    cbs.len = 0;
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&certs);
    s._M_str = auVar6._8_8_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = auVar6._0_8_;
    s._M_len = (size_t)s._M_str;
    SVar7 = bssl::StringAsBytes((bssl *)gtest_ar__1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl,s);
    cbs_st::cbs_st((cbs_st *)local_a8,SVar7);
    psVar5 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get(&local_38);
    iVar2 = PKCS12_get_key_and_certs((EVP_PKEY **)&cbs.len,psVar5,(CBS *)local_a8,"");
    local_d9 = iVar2 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_d8,&local_d9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)((long)&data_1.field_2 + 8),(internal *)local_d8,
                 (AssertionResult *)"PKCS12_get_key_and_certs(&key, certs.get(), &cbs, \"\")","true"
                 ,"false",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x298,pcVar4);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      std::__cxx11::string::~string((string *)(data_1.field_2._M_local_buf + 8));
      testing::Message::~Message(&local_e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    bVar1 = false;
  }
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  std::__cxx11::string::~string((string *)&certs);
  if (!bVar1) {
    GetTestData_abi_cxx11_((string *)&certs_1,"crypto/pkcs8/test/bad2.p12");
    psVar3 = sk_X509_new_null();
    std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&gtest_ar__2.message_,psVar3);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<stack_st_X509,bssl::internal::Deleter>>
              ((AssertionResult *)local_148,
               (unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar__2.message_,
               (type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&key_1,(internal *)local_148,(AssertionResult *)0x8ba81c,"false","true",
                 in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x29d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_158,&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      std::__cxx11::string::~string((string *)&key_1);
      testing::Message::~Message(&local_150);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
    if (!bVar1) {
      cbs_1.len = 0;
      auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&certs_1);
      s_00._M_str = auVar6._8_8_;
      gtest_ar__3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl = auVar6._0_8_;
      s_00._M_len = (size_t)s_00._M_str;
      SVar7 = bssl::StringAsBytes((bssl *)gtest_ar__3.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl,s_00);
      cbs_st::cbs_st((cbs_st *)local_190,SVar7);
      psVar5 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                         ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                          &gtest_ar__2.message_);
      iVar2 = PKCS12_get_key_and_certs((EVP_PKEY **)&cbs_1.len,psVar5,(CBS *)local_190,"");
      local_1c1 = iVar2 == 0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
      if (!bVar1) {
        testing::Message::Message(&local_1d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)((long)&data_2.field_2 + 8),(internal *)local_1c0,
                   (AssertionResult *)"PKCS12_get_key_and_certs(&key, certs.get(), &cbs, \"\")",
                   "true","false",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x2a0,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
        testing::internal::AssertHelper::~AssertHelper(&local_1d8);
        std::__cxx11::string::~string((string *)(data_2.field_2._M_local_buf + 8));
        testing::Message::~Message(&local_1d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
      bVar1 = false;
    }
    std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    std::__cxx11::string::~string((string *)&certs_1);
    if (!bVar1) {
      GetTestData_abi_cxx11_((string *)&certs_2,"crypto/pkcs8/test/bad3.p12");
      psVar3 = sk_X509_new_null();
      std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&gtest_ar__4.message_,psVar3);
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<stack_st_X509,bssl::internal::Deleter>>
                ((AssertionResult *)local_230,
                 (unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                 (type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
      if (!bVar1) {
        testing::Message::Message(&local_238);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&key_2,(internal *)local_230,(AssertionResult *)0x8ba81c,"false","true"
                   ,in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_240,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x2a5,pcVar4);
        testing::internal::AssertHelper::operator=(&local_240,&local_238);
        testing::internal::AssertHelper::~AssertHelper(&local_240);
        std::__cxx11::string::~string((string *)&key_2);
        testing::Message::~Message(&local_238);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
      if (bVar1) {
        cbs_2.len = 0;
        auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&certs_2);
        s_01._M_str = auVar6._8_8_;
        gtest_ar__5.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl = auVar6._0_8_;
        s_01._M_len = (size_t)s_01._M_str;
        SVar7 = bssl::StringAsBytes((bssl *)gtest_ar__5.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl,s_01);
        cbs_st::cbs_st((cbs_st *)local_278,SVar7);
        psVar5 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                           ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                            &gtest_ar__4.message_);
        iVar2 = PKCS12_get_key_and_certs((EVP_PKEY **)&cbs_2.len,psVar5,(CBS *)local_278,"");
        local_2a9 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_2a8,&local_2a9,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
        if (!bVar1) {
          testing::Message::Message(&local_2b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_2e0,(internal *)local_2a8,
                     (AssertionResult *)"PKCS12_get_key_and_certs(&key, certs.get(), &cbs, \"\")",
                     "true","false",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x2a8,pcVar4);
          testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
          testing::internal::AssertHelper::~AssertHelper(&local_2c0);
          std::__cxx11::string::~string((string *)&local_2e0);
          testing::Message::~Message(&local_2b8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
      }
      std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
      std::__cxx11::string::~string((string *)&certs_2);
    }
  }
  return;
}

Assistant:

TEST(PKCS12Test, MissingContent) {
  {
    std::string data = GetTestData("crypto/pkcs8/test/bad1.p12");
    bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
    ASSERT_TRUE(certs);
    EVP_PKEY *key = nullptr;
    CBS cbs = bssl::StringAsBytes(data);
    EXPECT_FALSE(PKCS12_get_key_and_certs(&key, certs.get(), &cbs, ""));
  }
  {
    std::string data = GetTestData("crypto/pkcs8/test/bad2.p12");
    bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
    ASSERT_TRUE(certs);
    EVP_PKEY *key = nullptr;
    CBS cbs = bssl::StringAsBytes(data);
    EXPECT_FALSE(PKCS12_get_key_and_certs(&key, certs.get(), &cbs, ""));
  }
  {
    std::string data = GetTestData("crypto/pkcs8/test/bad3.p12");
    bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
    ASSERT_TRUE(certs);
    EVP_PKEY *key = nullptr;
    CBS cbs = bssl::StringAsBytes(data);
    EXPECT_FALSE(PKCS12_get_key_and_certs(&key, certs.get(), &cbs, ""));
  }
}